

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O0

void buffer_reserve(buffer *b,int sz)

{
  uint8_t *puVar1;
  int sz_local;
  buffer *b_local;
  
  if (b->cap < b->size + sz) {
    do {
      b->cap = b->cap << 1;
    } while (b->cap <= b->size + sz);
    if (b->ptr == b->buffer) {
      puVar1 = (uint8_t *)malloc((long)b->cap);
      b->ptr = puVar1;
      memcpy(b->ptr,b->buffer,(long)b->size);
    }
    else {
      puVar1 = (uint8_t *)realloc(b->ptr,(long)b->cap);
      b->ptr = puVar1;
    }
  }
  return;
}

Assistant:

static inline void
buffer_reserve(struct buffer *b, int sz) {
	if (b->size + sz <= b->cap)
		return;
	do {
		b->cap *= 2;
	} while (b->cap <= b->size + sz);

	if (b->ptr == b->buffer) {
		b->ptr = skynet_malloc(b->cap);
		memcpy(b->ptr, b->buffer, b->size);
	} else {
		b->ptr = skynet_realloc(b->ptr, b->cap);
	}
}